

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_wavelength_set.unit.cpp
# Opt level: O3

void __thiscall
TestCreateWavelengthSet_TestCreateWavelengthSet_Source_Test::
~TestCreateWavelengthSet_TestCreateWavelengthSet_Source_Test
          (TestCreateWavelengthSet_TestCreateWavelengthSet_Source_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(TestCreateWavelengthSet, TestCreateWavelengthSet_Source) {
	SCOPED_TRACE("Begin Test: Create Wavelength Set Source.");

	std::string line = "Source";

	Wavelength_Set wl_set = create_wavelength_set(line, "");

	EXPECT_EQ(wl_set.type, Wavelength_Set_Type::SOURCE);
	EXPECT_EQ(wl_set.description, "Source");
	std::vector<double> empty_vec;
	EXPECT_EQ(wl_set.values, empty_vec);
}